

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refl_coef_to_lpc.c
# Opt level: O2

void WebRtcSpl_ReflCoefToLpc(int16_t *k,int use_order,int16_t *a)

{
  short sVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  short local_38 [8];
  int16_t any [15];
  
  *a = 0x1000;
  local_38[0] = 0x1000;
  a[1] = (int16_t)((uint)(int)*k >> 3);
  lVar2 = 1;
  iVar4 = 3;
  lVar5 = 2;
  while (lVar2 < use_order) {
    sVar1 = k[1];
    k = k + 1;
    local_38[lVar2 + 1] = (short)((uint)(int)sVar1 >> 3);
    lVar2 = lVar2 + 1;
    lVar3 = 2;
    for (lVar6 = lVar5; lVar6 != 0; lVar6 = lVar6 + -2) {
      *(short *)((long)local_38 + lVar3) =
           (short)((uint)((int)*(short *)((long)a + lVar6) * (int)sVar1) >> 0xf) +
           *(short *)((long)a + lVar3);
      lVar3 = lVar3 + 2;
    }
    for (lVar6 = 0; iVar4 != (int)lVar6; lVar6 = lVar6 + 1) {
      a[lVar6] = local_38[lVar6];
    }
    lVar5 = lVar5 + 2;
    iVar4 = iVar4 + 1;
  }
  return;
}

Assistant:

void WebRtcSpl_ReflCoefToLpc(const int16_t *k, int use_order, int16_t *a)
{
    int16_t any[WEBRTC_SPL_MAX_LPC_ORDER + 1];
    int16_t *aptr, *aptr2, *anyptr;
    const int16_t *kptr;
    int m, i;

    kptr = k;
    *a = 4096; // i.e., (Word16_MAX >> 3)+1.
    *any = *a;
    a[1] = *k >> 3;

    for (m = 1; m < use_order; m++)
    {
        kptr++;
        aptr = a;
        aptr++;
        aptr2 = &a[m];
        anyptr = any;
        anyptr++;

        any[m + 1] = *kptr >> 3;
        for (i = 0; i < m; i++)
        {
            *anyptr = *aptr + (int16_t)((*aptr2 * *kptr) >> 15);
            anyptr++;
            aptr++;
            aptr2--;
        }

        aptr = a;
        anyptr = any;
        for (i = 0; i < (m + 2); i++)
        {
            *aptr = *anyptr;
            aptr++;
            anyptr++;
        }
    }
}